

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O0

MPP_RET vcodec_service_reg_rd(void *ctx,MppDevRegRdCfg *cfg)

{
  uint *puVar1;
  VcodecRegCfg *send_cfg;
  MppDevVcodecService *p;
  MppDevRegRdCfg *cfg_local;
  void *ctx_local;
  
  puVar1 = (uint *)((long)ctx + (long)*(int *)((long)ctx + 0x1c) * 0xa0 + 0x28);
  if ((cfg->offset != 0) &&
     (_mpp_log_l(2,"vcodec_service","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->offset == 0",
                 "vcodec_service_reg_rd",0x265), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  *(void **)(puVar1 + 0x26) = cfg->reg;
  if (*puVar1 != cfg->size) {
    _mpp_log_l(2,"vcodec_service","reg size mismatch rd %d rd %d\n","vcodec_service_reg_rd",
               (ulong)*puVar1,(ulong)cfg->size);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vcodec_service_reg_rd(void *ctx, MppDevRegRdCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];

    mpp_assert(cfg->offset == 0);
    send_cfg->reg_get = cfg->reg;
    if (send_cfg->reg_size != cfg->size)
        mpp_err_f("reg size mismatch rd %d rd %d\n",
                  send_cfg->reg_size, cfg->size);

    return MPP_OK;
}